

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,_4U>::swizzle(ImageT<unsigned_int,_4U> *this,string_view swizzle)

{
  Color *pCVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Color srcPixel;
  anon_union_16_2_6556a7fb_for_color<unsigned_int,_4U>_3 local_48;
  
  if (swizzle._M_len == 4) {
    if ((this->super_Image).height * (this->super_Image).width != 0) {
      uVar6 = 0;
      do {
        pCVar1 = this->pixels + uVar6;
        local_48.comps[0] = (pCVar1->field_0).comps[0];
        local_48.comps[1] = (pCVar1->field_0).comps[1];
        local_48.comps[2] = (pCVar1->field_0).comps[2];
        local_48.comps[3] = (pCVar1->field_0).comps[3];
        iVar2 = (*(this->super_Image)._vptr_Image[5])(this);
        if (iVar2 != 0) {
          uVar5 = 0;
          do {
            pCVar1 = this->pixels;
            uVar3 = swizzlePixel(this,(Color *)&local_48.field_1,swizzle._M_str[uVar5]);
            uVar4 = 3;
            if ((uint)uVar5 < 3) {
              uVar4 = uVar5 & 0xffffffff;
            }
            pCVar1[uVar6].field_0.comps[uVar4] = uVar3;
            uVar5 = uVar5 + 1;
            uVar3 = (*(this->super_Image)._vptr_Image[5])(this);
          } while (uVar5 < uVar3);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->super_Image).height * (this->super_Image).width);
    }
    return this;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::swizzle(std::string_view) [componentType = unsigned int, componentCount = 4]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }